

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fragment.cpp
# Opt level: O0

dispatcher_ptr __thiscall
anon_unknown.dwarf_1d342e::make_dispatcher
          (anon_unknown_dwarf_1d342e *this,fragment *f,section_kind kind,
          not_null<std::aligned_storage<16UL,_8UL>::type_*> buffer)

{
  bool bVar1;
  error_code eVar2;
  error_code erc;
  section_kind kind_local;
  fragment *f_local;
  not_null<std::aligned_storage<16UL,_8UL>::type_*> buffer_local;
  
  bVar1 = pstore::repo::fragment::has_section(f,kind);
  if (!bVar1) {
    pstore::assert_failed
              ("f.has_section (kind)",
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/mcrepo/fragment.cpp"
               ,0x45);
  }
  switch(kind) {
  case text:
    make_dispatcher_for_kind<(pstore::repo::section_kind)0>(this,f,buffer);
    break;
  case data:
    make_dispatcher_for_kind<(pstore::repo::section_kind)1>(this,f,buffer);
    break;
  case bss:
    make_dispatcher_for_kind<(pstore::repo::section_kind)2>(this,f,buffer);
    break;
  case rel_ro:
    make_dispatcher_for_kind<(pstore::repo::section_kind)3>(this,f,buffer);
    break;
  case mergeable_1_byte_c_string:
    make_dispatcher_for_kind<(pstore::repo::section_kind)4>(this,f,buffer);
    break;
  case mergeable_2_byte_c_string:
    make_dispatcher_for_kind<(pstore::repo::section_kind)5>(this,f,buffer);
    break;
  case mergeable_4_byte_c_string:
    make_dispatcher_for_kind<(pstore::repo::section_kind)6>(this,f,buffer);
    break;
  case mergeable_const_4:
    make_dispatcher_for_kind<(pstore::repo::section_kind)7>(this,f,buffer);
    break;
  case mergeable_const_8:
    make_dispatcher_for_kind<(pstore::repo::section_kind)8>(this,f,buffer);
    break;
  case mergeable_const_16:
    make_dispatcher_for_kind<(pstore::repo::section_kind)9>(this,f,buffer);
    break;
  case mergeable_const_32:
    make_dispatcher_for_kind<(pstore::repo::section_kind)10>(this,f,buffer);
    break;
  case read_only:
    make_dispatcher_for_kind<(pstore::repo::section_kind)11>(this,f,buffer);
    break;
  case thread_data:
    make_dispatcher_for_kind<(pstore::repo::section_kind)12>(this,f,buffer);
    break;
  case thread_bss:
    make_dispatcher_for_kind<(pstore::repo::section_kind)13>(this,f,buffer);
    break;
  case debug_line:
    make_dispatcher_for_kind<(pstore::repo::section_kind)14>(this,f,buffer);
    break;
  case debug_loc:
    make_dispatcher_for_kind<(pstore::repo::section_kind)15>(this,f,buffer);
    break;
  case debug_string:
    make_dispatcher_for_kind<(pstore::repo::section_kind)16>(this,f,buffer);
    break;
  case debug_ranges:
    make_dispatcher_for_kind<(pstore::repo::section_kind)17>(this,f,buffer);
    break;
  case linked_definitions:
    make_dispatcher_for_kind<(pstore::repo::section_kind)18>(this,f,buffer);
    break;
  case last:
  default:
    eVar2 = pstore::repo::make_error_code(bad_fragment_type);
    erc._M_cat = eVar2._M_cat;
    erc._0_8_ = erc._M_cat;
    pstore::raise_error_code<std::error_code>((pstore *)(ulong)(uint)eVar2._M_value,erc);
  }
  return (__uniq_ptr_data<pstore::repo::dispatcher,_(anonymous_namespace)::nop_deleter,_true,_true>)
         (__uniq_ptr_data<pstore::repo::dispatcher,_(anonymous_namespace)::nop_deleter,_true,_true>)
         this;
}

Assistant:

dispatcher_ptr make_dispatcher (fragment const & f, section_kind const kind,
                                    pstore::gsl::not_null<dispatcher_buffer *> const buffer) {
        PSTORE_ASSERT (f.has_section (kind));

#define X(k)                                                                                       \
    case section_kind::k: return make_dispatcher_for_kind<section_kind::k> (f, buffer);
        switch (kind) {
            PSTORE_MCREPO_SECTION_KINDS
        case section_kind::last: break;
        }
#undef X
        pstore::raise_error_code (make_error_code (pstore::repo::error_code::bad_fragment_type));
    }